

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O0

parser_error parse_vault_name(parser *p)

{
  void *pvVar1;
  undefined8 *v_00;
  char *pcVar2;
  vault *v;
  vault *h;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  v_00 = (undefined8 *)mem_zalloc(0x28);
  pcVar2 = parser_getstr(p,"name");
  pcVar2 = string_make(pcVar2);
  v_00[1] = pcVar2;
  *v_00 = pvVar1;
  parser_setpriv(p,v_00);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_vault_name(struct parser *p) {
	struct vault *h = parser_priv(p);
	struct vault *v = mem_zalloc(sizeof *v);

	v->name = string_make(parser_getstr(p, "name"));
	v->next = h;
	parser_setpriv(p, v);
	return PARSE_ERROR_NONE;
}